

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O0

void __thiscall MathOp::Div_Const_Trunc::forward(Div_Const_Trunc *this)

{
  bool bVar1;
  Mat *in_RDI;
  Mat *in_stack_ffffffffffffffc8;
  Mat *in_stack_ffffffffffffffd0;
  ll128 *in_stack_fffffffffffffff0;
  Mat *this_00;
  
  this_00 = in_RDI;
  Op::reinit((Op *)in_RDI);
  if (in_RDI->order == 1) {
    Mat::operator*(this_00,in_stack_fffffffffffffff0);
    Mat::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    Mat::~Mat((Mat *)0x123d44);
  }
  else if (in_RDI->order == 2) {
    (*(code *)**(undefined8 **)
                in_RDI[1].val.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                super__Vector_impl_data._M_finish)();
    bVar1 = Op::forwardHasNext((Op *)in_RDI[1].val.
                                     super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl
                                     .super__Vector_impl_data._M_finish);
    if (bVar1) {
      in_RDI->order = in_RDI->order + -1;
    }
  }
  return;
}

Assistant:

void MathOp::Div_Const_Trunc::forward() {
    reinit();
    switch (forwardRound) {
        case 1:
//            *res = (*a * (IE / b));
            *res = *a * b;
            break;
        case 2:
            div2mP->forward();
            if (div2mP->forwardHasNext()) {
                forwardRound--;
            }
            break;
    }
}